

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

float stbir__filter_triangle(float x,float s)

{
  float s_local;
  float x_local;
  
  if (1.0 < ABS(x)) {
    s_local = 0.0;
  }
  else {
    s_local = 1.0 - ABS(x);
  }
  return s_local;
}

Assistant:

static float stbir__filter_triangle(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x <= 1.0f)
        return 1 - x;
    else
        return 0;
}